

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcSaucy.c
# Opt level: O3

void fix_diff_singleton(saucy *s,int cf)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  
  if ((s->right).clen[cf] == 0) {
    iVar1 = (s->right).lab[cf];
    iVar2 = (s->left).lab[cf];
    if (iVar1 != iVar2) {
      add_diff(s,iVar1);
      s->nundiffs = s->nundiffs + 1;
      piVar4 = s->undiffnons;
      if (piVar4[iVar1] != -1) {
        iVar3 = s->ndiffnons;
        s->ndiffnons = iVar3 + -1;
        iVar3 = s->diffnons[(long)iVar3 + -1];
        s->diffnons[piVar4[iVar1]] = iVar3;
        piVar4[iVar3] = piVar4[iVar1];
        piVar4[iVar1] = -1;
      }
      iVar3 = (s->right).cfront[iVar2];
      if ((s->right).clen[iVar3] == 0) {
        piVar4 = s->unpairs;
        if (piVar4[iVar1] != -1) {
          iVar2 = s->npairs;
          s->npairs = iVar2 + -1;
          iVar2 = s->pairs[(long)iVar2 + -1];
          s->pairs[piVar4[iVar1]] = iVar2;
          piVar4[iVar2] = piVar4[iVar1];
          piVar4[iVar1] = -1;
        }
      }
      else {
        add_diff(s,iVar2);
        iVar1 = (s->left).unlab[iVar1];
        if (((iVar3 <= iVar1) && (iVar1 <= (s->right).clen[iVar3] + iVar3)) && (s->npairs != -1)) {
          s->unpairs[iVar2] = s->npairs;
          iVar1 = s->npairs;
          s->npairs = iVar1 + 1;
          s->pairs[iVar1] = iVar2;
        }
      }
    }
  }
  return;
}

Assistant:

static void
fix_diff_singleton(struct saucy *s, int cf)
{
    int r = s->right.lab[cf];
    int l = s->left.lab[cf];
    int rcfl;

    if (!s->right.clen[cf] && r != l) {

        /* Make sure diff is marked */
        add_diff(s, r);

        /* It is now undiffed since it is singleton */
        ++s->nundiffs;
        remove_diffnon(s, r);

        /* Mark the other if not singleton already */
        rcfl = s->right.cfront[l];
        if (s->right.clen[rcfl]) {
            add_diff(s, l);

            /* Check for pairs */
            if (in_cell_range(&s->right, s->left.unlab[r], rcfl)) {
                add_pair(s, l);
            }
        }
        /* Otherwise we might be eating a pair */
        else if (is_a_pair(s, r)) {
            eat_pair(s, r);
        }
    }
}